

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O2

void * __thiscall
DefaultSysAllocator::Alloc
          (DefaultSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  SysAllocator *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      this->failed_[0] = false;
      this->failed_[1] = false;
      return (void *)0x0;
    }
    if ((this->failed_[lVar3] == false) &&
       (pSVar1 = this->allocs_[lVar3], pSVar1 != (SysAllocator *)0x0)) {
      iVar2 = (*pSVar1->_vptr_SysAllocator[2])(pSVar1,size,actual_size,alignment);
      if ((void *)CONCAT44(extraout_var,iVar2) != (void *)0x0) {
        return (void *)CONCAT44(extraout_var,iVar2);
      }
      this->failed_[lVar3] = true;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void* DefaultSysAllocator::Alloc(size_t size, size_t *actual_size,
                                 size_t alignment) {
  for (int i = 0; i < kMaxAllocators; i++) {
    if (!failed_[i] && allocs_[i] != nullptr) {
      void* result = allocs_[i]->Alloc(size, actual_size, alignment);
      if (result != nullptr) {
        return result;
      }
      failed_[i] = true;
    }
  }
  // After both failed, reset "failed_" to false so that a single failed
  // allocation won't make the allocator never work again.
  for (int i = 0; i < kMaxAllocators; i++) {
    failed_[i] = false;
  }
  return nullptr;
}